

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O0

void anon_unknown.dwarf_51ec9::dump_source_class(MetaClass *top,ofstream *file)

{
  bool bVar1;
  __shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *this;
  element_type *top_00;
  ostream *poVar2;
  __shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  long lVar5;
  element_type *peVar6;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  __shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_1c8;
  shared_ptr<MetaProperty> *p_3;
  iterator __end1_7;
  iterator __begin1_7;
  vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_> *__range1_7
  ;
  __shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_188;
  shared_ptr<MetaClass> *c_2;
  iterator __end1_6;
  iterator __begin1_6;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1_6;
  shared_ptr<MetaProperty> *p_2;
  iterator __end1_5;
  iterator __begin1_5;
  vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_> *__range1_5
  ;
  __shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_128;
  shared_ptr<MetaProperty> *p_1;
  iterator __end1_4;
  iterator __begin1_4;
  vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_> *__range1_4
  ;
  string local_e8;
  __shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_c8;
  shared_ptr<MetaClass> *c_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1_3;
  shared_ptr<MetaProperty> *p;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_> *__range1_2
  ;
  string local_78;
  __shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_58;
  shared_ptr<MetaClass> *c;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1_1;
  shared_ptr<MetaClass> *child;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1;
  ofstream *file_local;
  MetaClass *top_local;
  
  __end1 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
           begin(&top->subclasses);
  child = (shared_ptr<MetaClass> *)
          std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::end
                    (&top->subclasses);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                                     *)&child), bVar1) {
    this = &__gnu_cxx::
            __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
            ::operator*(&__end1)->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>;
    top_00 = std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::get(this);
    dump_source_class(top_00,file);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
    ::operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)file,(string *)&top->name);
  poVar2 = std::operator<<(poVar2,"::");
  poVar2 = std::operator<<(poVar2,(string *)&top->name);
  std::operator<<(poVar2,"(QObject *parent) : QObject(parent)");
  __end1_1 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
             begin(&top->subclasses);
  c = (shared_ptr<MetaClass> *)
      std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::end
                (&top->subclasses);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                             *)&c), bVar1) {
    local_58 = (__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
               ::operator*(&__end1_1);
    poVar2 = std::operator<<((ostream *)file,',');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"\t_");
    peVar4 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_58);
    decapitalize(&local_78,&peVar4->name,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_78);
    poVar2 = std::operator<<(poVar2,"(new ");
    peVar4 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_58);
    poVar2 = std::operator<<(poVar2,(string *)&peVar4->name);
    std::operator<<(poVar2,"(this))");
    std::__cxx11::string::~string((string *)&local_78);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
             ::begin(&top->properties);
  p = (shared_ptr<MetaProperty> *)
      std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>::
      end(&top->properties);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
                             *)&p), bVar1) {
    p_Var3 = (__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
             ::operator*(&__end1_2);
    std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (p_Var3);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      poVar2 = std::operator<<((ostream *)file,',');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"\t_");
      peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var3);
      poVar2 = std::operator<<(poVar2,(string *)&peVar6->name);
      poVar2 = std::operator<<(poVar2,'(');
      peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var3);
      poVar2 = std::operator<<(poVar2,(string *)&peVar6->default_value);
      std::operator<<(poVar2,')');
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
    ::operator++(&__end1_2);
  }
  std::ostream::operator<<((ostream *)file,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)file,'{');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&top->parent);
  if (!bVar1) {
    std::operator<<((ostream *)file,"\tload();\n");
  }
  poVar2 = std::operator<<((ostream *)file,'}');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)file,std::endl<char,std::char_traits<char>>);
  dump_source_get_methods(file,top);
  __end1_3 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
             begin(&top->subclasses);
  c_1 = (shared_ptr<MetaClass> *)
        std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::end
                  (&top->subclasses);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                             *)&c_1), bVar1) {
    local_c8 = (__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
               ::operator*(&__end1_3);
    peVar4 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_c8);
    poVar2 = std::operator<<((ostream *)file,(string *)&peVar4->name);
    poVar2 = std::operator<<(poVar2,"* ");
    poVar2 = std::operator<<(poVar2,(string *)&top->name);
    poVar2 = std::operator<<(poVar2,"::");
    peVar4 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_c8);
    decapitalize(&local_e8,&peVar4->name,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_e8);
    poVar2 = std::operator<<(poVar2,"() const");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e8);
    poVar2 = std::operator<<((ostream *)file,'{');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,"\treturn _");
    peVar4 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_c8);
    decapitalize((string *)&__range1_4,&peVar4->name,0);
    poVar2 = std::operator<<(poVar2,(string *)&__range1_4);
    poVar2 = std::operator<<(poVar2,';');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&__range1_4);
    poVar2 = std::operator<<((ostream *)file,'}');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)file,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
    ::operator++(&__end1_3);
  }
  dump_source_set_methods(file,top,true);
  __end1_4 = std::
             vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
             ::begin(&top->properties);
  p_1 = (shared_ptr<MetaProperty> *)
        std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ::end(&top->properties);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
                             *)&p_1), bVar1) {
    local_128 = (__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
                ::operator*(&__end1_4);
    poVar2 = std::operator<<((ostream *)file,"void ");
    poVar2 = std::operator<<(poVar2,(string *)&top->name);
    poVar2 = std::operator<<(poVar2,"::set");
    peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_128);
    capitalize((string *)&__range1_5,&peVar6->name,0);
    poVar2 = std::operator<<(poVar2,(string *)&__range1_5);
    poVar2 = std::operator<<(poVar2,"Rule(std::function<bool(");
    peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_128);
    poVar2 = std::operator<<(poVar2,(string *)&peVar6->type);
    poVar2 = std::operator<<(poVar2,")> rule)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&__range1_5);
    poVar2 = std::operator<<((ostream *)file,'{');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,'\t');
    peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_128);
    poVar2 = std::operator<<(poVar2,(string *)&peVar6->name);
    poVar2 = std::operator<<(poVar2,"Rule = rule;");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,'}');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)file,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
    ::operator++(&__end1_4);
  }
  __end1_5 = std::
             vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
             ::begin(&top->properties);
  p_2 = (shared_ptr<MetaProperty> *)
        std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ::end(&top->properties);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_5,
                            (__normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
                             *)&p_2), bVar1) {
    p_Var3 = (__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
             ::operator*(&__end1_5);
    std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (p_Var3);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var3);
      poVar2 = std::operator<<((ostream *)file,(string *)&peVar6->type);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,(string *)&top->name);
      poVar2 = std::operator<<(poVar2,"::");
      peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var3);
      poVar2 = std::operator<<(poVar2,(string *)&peVar6->name);
      poVar2 = std::operator<<(poVar2,"Default() const");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)file,'{');
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)file,'\t');
      poVar2 = std::operator<<(poVar2,"return ");
      peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var3);
      poVar2 = std::operator<<(poVar2,(string *)&peVar6->default_value);
      poVar2 = std::operator<<(poVar2,';');
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)file,'}');
      std::ostream::operator<<((ostream *)file,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
    ::operator++(&__end1_5);
  }
  poVar2 = std::operator<<((ostream *)file,"void ");
  poVar2 = std::operator<<(poVar2,(string *)&top->name);
  poVar2 = std::operator<<(poVar2,"::loadDefaults()");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)file,"{");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1_6 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
             begin(&top->subclasses);
  c_2 = (shared_ptr<MetaClass> *)
        std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::end
                  (&top->subclasses);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_6,
                            (__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                             *)&c_2), bVar1) {
    local_188 = (__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                ::operator*(&__end1_6);
    poVar2 = std::operator<<((ostream *)file,"\t_");
    peVar4 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_188);
    decapitalize((string *)&__range1_7,&peVar4->name,0);
    poVar2 = std::operator<<(poVar2,(string *)&__range1_7);
    poVar2 = std::operator<<(poVar2,"->loadDefaults();");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&__range1_7);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
    ::operator++(&__end1_6);
  }
  __end1_7 = std::
             vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
             ::begin(&top->properties);
  p_3 = (shared_ptr<MetaProperty> *)
        std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ::end(&top->properties);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_7,
                            (__normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
                             *)&p_3), bVar1) {
    local_1c8 = (__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
                ::operator*(&__end1_7);
    std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (local_1c8);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      poVar2 = std::operator<<((ostream *)file,"\tset");
      peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_1c8);
      capitalize(&local_1e8,&peVar6->name,0);
      poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
      poVar2 = std::operator<<(poVar2,'(');
      peVar6 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_1c8);
      poVar2 = std::operator<<(poVar2,(string *)&peVar6->default_value);
      poVar2 = std::operator<<(poVar2,");");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaProperty>_*,_std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>_>
    ::operator++(&__end1_7);
  }
  poVar2 = std::operator<<((ostream *)file,"}");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&top->parent);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)file,"void ");
    poVar2 = std::operator<<(poVar2,(string *)&top->name);
    poVar2 = std::operator<<(poVar2,"::sync()");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,'{');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    bVar1 = class_or_subclass_have_properties(top);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)file,
                               "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"internal_config",&local_209);
      dump_source_class_settings_set_values(top,file,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
    }
    poVar2 = std::operator<<((ostream *)file,'}');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)file,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,"void ");
    poVar2 = std::operator<<(poVar2,(string *)&top->name);
    poVar2 = std::operator<<(poVar2,"::load()");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,'{');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    bVar1 = class_or_subclass_have_properties(top);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)file,
                               "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"internal_config",&local_231);
      dump_source_class_settings_get_values(top,file,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
    }
    poVar2 = std::operator<<((ostream *)file,'}');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)file,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,(string *)&top->name);
    poVar2 = std::operator<<(poVar2,"* ");
    poVar2 = std::operator<<(poVar2,(string *)&top->name);
    poVar2 = std::operator<<(poVar2,"::self()");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,"{");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,"\tstatic ");
    poVar2 = std::operator<<(poVar2,(string *)&top->name);
    poVar2 = std::operator<<(poVar2," s;");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,"\treturn &s;");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)file,"}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void dump_source_class(MetaClass *top, std::ofstream &file) {
  for (auto &&child : top->subclasses) {
    dump_source_class(child.get(), file);
  }

  // Constructors.
  file << top->name << "::" << top->name
       << "(QObject *parent) : QObject(parent)";
  for (auto &&c : top->subclasses) {
    file << ',' << std::endl
         << "\t_" << decapitalize(c->name, 0) << "(new " << c->name
         << "(this))";
  }
  for (auto &&p : top->properties) {
    if (p->default_value.size()) {
      file << ',' << std::endl
           << "\t_" << p->name << '(' << p->default_value << ')';
    }
  }
  file << std::endl;
  file << '{' << std::endl;
  if (!top->parent) {
    file << "\tload();\n";
  }
  file << '}' << std::endl;
  file << std::endl;

  // get - methods.
  dump_source_get_methods(file, top);
  for (auto &&c : top->subclasses) {
    file << c->name << "* " << top->name << "::" << decapitalize(c->name)
         << "() const" << std::endl;
    file << '{' << std::endl;
    file << "\treturn _" << decapitalize(c->name) << ';' << std::endl;
    file << '}' << std::endl;
    file << std::endl;
  }

  // set-methods
  dump_source_set_methods(file, top);

  // rule-methods {
  for (auto &&p : top->properties) {
    file << "void " << top->name << "::set" << capitalize(p->name, 0)
         << "Rule(std::function<bool(" << p->type << ")> rule)" << std::endl;
    file << '{' << std::endl;
    file << '\t' << p->name << "Rule = rule;" << std::endl;
    file << '}' << std::endl;
    file << std::endl;
  }

  // default values
  for (auto &&p : top->properties) {
      if (p->default_value.size()) {
          file << p->type << " " << top->name << "::" << p->name << "Default() const" << std::endl;
          file << '{' << std::endl;
          file << '\t' << "return " << p->default_value << ';' << std::endl;
          file << '}';
          file << std::endl;
    }
  }

  // load defaults
  file << "void " << top->name << "::loadDefaults()" << std::endl;
  file << "{" << std::endl;
  for (auto &&c : top->subclasses) {
    file << "\t_" << decapitalize(c->name, 0) << "->loadDefaults();" << std::endl;
  }

  for (auto &&p : top->properties) {
    if (p->default_value.size()) {
        file << "\tset" << capitalize(p->name, 0) << '(' << p->default_value << ");" << std::endl;
    }
  }
  file << "}" << std::endl;

  // main preferences class
  if (!top->parent) {
      // The Sync method.
    file << "void " << top->name << "::sync()" << std::endl;
    file << '{' << std::endl;
    if (class_or_subclass_have_properties(top)) {
      file << "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();" << std::endl;
      dump_source_class_settings_set_values(top, file, "internal_config");
    }
    file << '}' << std::endl;
    file << std::endl;

    // The "load" method.
    file << "void " << top->name << "::load()" << std::endl;
    file << '{' << std::endl;
    if (class_or_subclass_have_properties(top)) {
      file << "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();" << std::endl;
      dump_source_class_settings_get_values(top, file, "internal_config");
    }
    file << '}' << std::endl;
    file << std::endl;
    file << top->name << "* " << top->name << "::self()" << std::endl;
    file << "{" << std::endl;
    file << "\tstatic " << top->name << " s;" << std::endl;
    file << "\treturn &s;" << std::endl;
    file << "}" << std::endl;
  }
}